

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_attribute.c
# Opt level: O0

void attribute_destroy(attribute_conflict attr)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if ((*(long *)((long)in_RDI + 0x28) != 0) && (**(long **)((long)in_RDI + 0x28) != 0)) {
      (*(code *)**(undefined8 **)((long)in_RDI + 0x28))(in_RDI,*(undefined8 *)((long)in_RDI + 0x18))
      ;
    }
    if (*(long *)((long)in_RDI + 8) != 0) {
      free(*(void **)((long)in_RDI + 8));
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void attribute_destroy(attribute attr)
{
	if (attr)
	{
		if (attr->iface && attr->iface->destroy)
		{
			attr->iface->destroy(attr, attr->impl);
		}

		if (attr->name)
		{
			free(attr->name);
		}

		free(attr);
	}
}